

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdstore.cc
# Opt level: O2

int __thiscall bdStore::getPeer(bdStore *this,bdPeer *peer)

{
  int iVar1;
  long lVar2;
  _List_node_base *p_Var3;
  byte bVar4;
  iterator it;
  
  bVar4 = 0;
  it._M_node = (this->store).super__List_base<bdPeer,_std::allocator<bdPeer>_>._M_impl._M_node.
               super__List_node_base._M_next;
  std::advance<std::_List_iterator<bdPeer>,int>(&it,this->mIndex);
  if (it._M_node == (_List_node_base *)&this->store) {
    iVar1 = 0;
  }
  else {
    p_Var3 = it._M_node + 1;
    for (lVar2 = 0x44; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined1 *)&(peer->mPeerId).addr.sin_family = *(undefined1 *)&p_Var3->_M_next;
      p_Var3 = (_List_node_base *)((long)p_Var3 + (ulong)bVar4 * -2 + 1);
      peer = (bdPeer *)((long)peer + (ulong)bVar4 * -2 + 1);
    }
    this->mIndex = this->mIndex + 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int bdStore::getPeer(bdPeer *peer) {
#ifdef DEBUG_STORE
	fprintf(stderr, "bdStore::getPeer() %ld Peers left\n", (long) store.size());
#endif

    std::list<bdPeer>::iterator it = store.begin();
    std::advance(it, mIndex);
	if (it != store.end()) {
		*peer = *it;
		mIndex++;
		return 1;
	}
	return 0;
}